

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

_Bool is_quest(player *p,wchar_t level)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  if ((level != L'\0') && (z_info->quest_max != 0)) {
    lVar1 = 0;
    do {
      bVar2 = (uint)(&p->quests->level)[lVar1] == level;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = (ulong)((uint)z_info->quest_max * 0x30) - 0x30 != lVar1;
      lVar1 = lVar1 + 0x30;
    } while (bVar3);
    return bVar2;
  }
  return false;
}

Assistant:

bool is_quest(struct player *p, int level)
{
	size_t i;

	/* Town is never a quest */
	if (!level) return false;

	for (i = 0; i < z_info->quest_max; i++)
		if (p->quests[i].level == level)
			return true;

	return false;
}